

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

char * __thiscall
cmCustomCommandGenerator::GetCrossCompilingEmulator(cmCustomCommandGenerator *this,uint c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  cmGeneratorTarget *this_01;
  char *pcVar4;
  string local_40;
  
  this_00 = this->LG->Makefile;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CROSSCOMPILING","");
  bVar2 = cmMakefile::IsOn(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((((bVar2) &&
       (this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                            (this->LG,*(string **)
                                       &(this->CommandLines).
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_start[c].
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ), this_01 != (cmGeneratorTarget *)0x0)) &&
      (TVar3 = cmGeneratorTarget::GetType(this_01), TVar3 == EXECUTABLE)) &&
     (bVar2 = cmGeneratorTarget::IsImported(this_01), !bVar2)) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"CROSSCOMPILING_EMULATOR","");
    pcVar4 = cmGeneratorTarget::GetProperty(this_01,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == paVar1) {
      return pcVar4;
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    return pcVar4;
  }
  return (char *)0x0;
}

Assistant:

const char* cmCustomCommandGenerator::GetCrossCompilingEmulator(
  unsigned int c) const
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return nullptr;
  }
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      !target->IsImported()) {
    return target->GetProperty("CROSSCOMPILING_EMULATOR");
  }
  return nullptr;
}